

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O3

void stable_grail_sort_dyn_buffer(int **arr,size_t Len)

{
  uint uVar1;
  uint LExtBuf;
  int **extbuf;
  int *ExtBuf [512];
  int *apiStack_1028 [513];
  
  uVar1 = 1;
  do {
    LExtBuf = uVar1;
    uVar1 = LExtBuf * 2;
  } while (LExtBuf * LExtBuf < Len);
  extbuf = (int **)malloc((ulong)LExtBuf << 3);
  if (extbuf != (int **)0x0) {
    stable_grail_common_sort(arr,(int)Len,extbuf,LExtBuf);
    free(extbuf);
    return;
  }
  stable_grail_common_sort(arr,(int)Len,apiStack_1028,0x200);
  return;
}

Assistant:

void GRAIL_SORT_DYN_BUFFER(SORT_TYPE *arr, size_t Len) {
  int L = 1;
  SORT_TYPE *ExtBuf;

  while (L * L < Len) {
    L *= 2;
  }

  ExtBuf = SORT_NEW_BUFFER(L);

  if (ExtBuf == NULL) {
    GRAIL_SORT_FIXED_BUFFER(arr, Len);
  } else {
    GRAIL_COMMON_SORT(arr, (int)Len, ExtBuf, L);
    SORT_DELETE_BUFFER(ExtBuf);
  }
}